

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::PathTypeHandlerBase::SetSlotAndCache
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,
          PropertyRecord *propertyRecord,PropertyIndex index,Var value,PropertyValueInfo *info,
          PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  PropertyAttributes PVar4;
  undefined4 *puVar5;
  
  if (((this->super_DynamicTypeHandler).flags & 0x10) == 0) {
    bVar3 = ProcessFixedFieldChange
                      (this,instance,propertyId,index,value,
                       SUB41((flags & PropertyOperation_NonFixedValue) >> 6,0),propertyRecord);
    DynamicTypeHandler::SetSlotUnchecked(instance,(uint)index,value);
    if (bVar3) goto LAB_00dcf5ae;
    if (info == (PropertyValueInfo *)0x0) goto LAB_00dcf643;
    index = 0xffff;
    PVar4 = '\0';
  }
  else {
    DynamicTypeHandler::SetSlotUnchecked(instance,(uint)index,value);
LAB_00dcf5ae:
    pTVar1 = (instance->super_RecyclableObject).type.ptr;
    if ((*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\0') &&
       ((DAT_015d6361 != '\x01' || ((*(byte *)(*(long *)(pTVar1 + 1) + 9) & 0x18) == 0)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x304,
                                  "((instance->GetDynamicType()->GetIsShared()) || (FixPropsOnPathTypes() && instance->GetDynamicType()->GetTypeHandler()->GetIsOrMayBecomeShared()))"
                                  ,
                                  "(instance->GetDynamicType()->GetIsShared()) || (FixPropsOnPathTypes() && instance->GetDynamicType()->GetTypeHandler()->GetIsOrMayBecomeShared())"
                                 );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    PVar4 = '\x04';
    if (info == (PropertyValueInfo *)0x0) goto LAB_00dcf643;
  }
  info->m_instance = &instance->super_RecyclableObject;
  info->m_propertyIndex = index;
  info->m_attributes = PVar4;
  info->flags = InlineCacheNoFlags;
LAB_00dcf643:
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,instance,propertyId,value,possibleSideEffects);
  return;
}

Assistant:

void PathTypeHandlerBase::SetSlotAndCache(DynamicObject* instance, PropertyId propertyId, PropertyRecord const * propertyRecord, PropertyIndex index, Var value, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
#if ENABLE_FIXED_FIELDS
        // Don't populate inline cache if this handler isn't yet shared.  If we did, a new instance could
        // reach this handler without us noticing and we could fail to release the old singleton instance, which may later
        // become collectible (not referenced by anything other than this handler), thus we would leak the old singleton instance.
        bool populateInlineCache = GetIsShared() ||
            ProcessFixedFieldChange(instance, propertyId, index, value, (flags & PropertyOperation_NonFixedValue) != 0, propertyRecord);
#else
        bool populateInlineCache = true;
#endif

        SetSlotUnchecked(instance, index, value);

        if (populateInlineCache)
        {
#if ENABLE_FIXED_FIELDS
            Assert((instance->GetDynamicType()->GetIsShared()) || (FixPropsOnPathTypes() && instance->GetDynamicType()->GetTypeHandler()->GetIsOrMayBecomeShared()));
#endif
            // Can't assert the following.  With NewScObject we can jump to the type handler at the tip (where the singleton is),
            // even though we haven't yet initialized the properties all the way to the tip, and we don't want to kill
            // the singleton in that case yet.  It's basically a transient inconsistent state, but we have to live with it.
            // The user's code will never see the object in this state.
            //Assert(!instance->GetTypeHandler()->HasSingletonInstance());
            PropertyValueInfo::Set(info, instance, index);
        }
        else
        {
            PropertyValueInfo::SetNoCache(info, instance);
        }

        SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
    }